

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O0

string * __thiscall
libcellml::GeneratorProfile::interfaceComputeVariablesMethodString_abi_cxx11_
          (string *__return_storage_ptr__,GeneratorProfile *this,bool forDifferentialModel,
          bool withExternalVariables)

{
  bool withExternalVariables_local;
  bool forDifferentialModel_local;
  GeneratorProfile *this_local;
  
  if (forDifferentialModel) {
    if (withExternalVariables) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 (string *)&this->mPimpl->mInterfaceComputeVariablesMethodFdmWevString);
    }
    else {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 (string *)&this->mPimpl->mInterfaceComputeVariablesMethodFdmWoevString);
    }
  }
  else if (withExternalVariables) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)&this->mPimpl->mInterfaceComputeVariablesMethodFamWevString);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)&this->mPimpl->mInterfaceComputeVariablesMethodFamWoevString);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratorProfile::interfaceComputeVariablesMethodString(bool forDifferentialModel,
                                                                    bool withExternalVariables) const
{
    if (forDifferentialModel) {
        if (withExternalVariables) {
            return mPimpl->mInterfaceComputeVariablesMethodFdmWevString;
        }

        return mPimpl->mInterfaceComputeVariablesMethodFdmWoevString;
    }

    if (withExternalVariables) {
        return mPimpl->mInterfaceComputeVariablesMethodFamWevString;
    }

    return mPimpl->mInterfaceComputeVariablesMethodFamWoevString;
}